

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O2

TypeRef __thiscall clickhouse::Block::Iterator::Type(Iterator *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  TypeRef TVar1;
  
  std::__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)(*(long *)(*in_RSI + 8) + 0x20 + in_RSI[1] * 0x30) + 0x18));
  TVar1.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar1.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TypeRef)TVar1.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TypeRef Block::Iterator::Type() const {
    return block_.columns_[idx_].column->Type();
}